

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

Trivia __thiscall
slang::parsing::Trivia::withLocation
          (Trivia *this,BumpAllocator *alloc,SourceLocation anchorLocation)

{
  FullLocation *pFVar1;
  size_t sVar2;
  FullLocation *pFVar3;
  ulong uVar4;
  Trivia TVar5;
  
  if ((byte)(this->kind - SkippedTokens) < 3) {
    pFVar1 = (FullLocation *)(this->field_0).rawText.ptr;
    uVar4 = *(ulong *)((long)&this->field_0 + 8);
  }
  else {
    pFVar1 = BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>(alloc);
    if ((byte)(this->kind - SkippedTokens) < 3) {
      pFVar3 = (FullLocation *)0x46fee9;
      sVar2 = 0;
    }
    else {
      pFVar3 = (this->field_0).fullLocation;
      if (this->hasFullLocation == true) {
        sVar2 = (pFVar3->text)._M_len;
        pFVar3 = (FullLocation *)(pFVar3->text)._M_str;
      }
      else {
        sVar2 = (size_t)(this->field_0).rawText.len;
      }
    }
    (pFVar1->text)._M_len = sVar2;
    (pFVar1->text)._M_str = (char *)pFVar3;
    pFVar1->location =
         (SourceLocation)
         ((long)anchorLocation + sVar2 * -0x10000000 & 0xfffffffff0000000 |
         (ulong)(anchorLocation._0_4_ & 0xfffffff));
    uVar4 = (ulong)this->kind << 0x28 | 0x100000000;
  }
  TVar5._8_8_ = uVar4;
  TVar5.field_0.fullLocation = pFVar1;
  return TVar5;
}

Assistant:

Trivia Trivia::withLocation(BumpAllocator& alloc, SourceLocation anchorLocation) const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return *this;
        default:
            break;
    }

    auto resultLocation = alloc.emplace<FullLocation>();
    resultLocation->text = getRawText();
    resultLocation->location = anchorLocation - resultLocation->text.size();

    Trivia result;
    result.kind = kind;
    result.hasFullLocation = true;
    result.fullLocation = resultLocation;
    return result;
}